

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_object_impl.hpp
# Opt level: O0

void __thiscall
asio::detail::
io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
::io_object_impl<asio::io_context>
          (io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
           *this,int param_2,int param_3,io_context *context)

{
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *pdVar1;
  undefined8 *in_RDI;
  implementation_type *in_stack_ffffffffffffffa8;
  implementation_type *in_stack_ffffffffffffffc0;
  type in_stack_ffffffffffffffd4;
  basic_executor_type<std::allocator<void>,_0UL> *in_stack_ffffffffffffffd8;
  basic_executor_type<std::allocator<void>,_0UL> in_stack_ffffffffffffffe0;
  
  pdVar1 = use_service<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>>
                     ((io_context *)0x1c32aa);
  *in_RDI = pdVar1;
  pdVar1 = (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            *)(in_RDI + 1);
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::implementation_type::implementation_type(in_stack_ffffffffffffffc0);
  io_context::get_executor((io_context *)in_stack_ffffffffffffffa8);
  any_io_executor::any_io_executor<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>
            ((any_io_executor *)in_stack_ffffffffffffffe0.target_,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd4);
  io_context::basic_executor_type<std::allocator<void>,_0UL>::~basic_executor_type
            ((basic_executor_type<std::allocator<void>,_0UL> *)&stack0xffffffffffffffe0);
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::construct(pdVar1,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

explicit io_object_impl(int, int, ExecutionContext& context)
    : service_(&asio::use_service<IoObjectService>(context)),
      executor_(context.get_executor())
  {
    service_->construct(implementation_);
  }